

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_set_b32(secp256k1_scalar *r,uchar *b32,int *overflow)

{
  uint overflow_00;
  int iVar1;
  int over;
  int *overflow_local;
  uchar *b32_local;
  secp256k1_scalar *r_local;
  
  r->d[0] = CONCAT17(b32[0x18],
                     CONCAT16(b32[0x19],
                              CONCAT15(b32[0x1a],
                                       CONCAT14(b32[0x1b],
                                                CONCAT13(b32[0x1c],
                                                         CONCAT12(b32[0x1d],
                                                                  CONCAT11(b32[0x1e],b32[0x1f]))))))
                    );
  r->d[1] = CONCAT17(b32[0x10],
                     CONCAT16(b32[0x11],
                              CONCAT15(b32[0x12],
                                       CONCAT14(b32[0x13],
                                                CONCAT13(b32[0x14],
                                                         CONCAT12(b32[0x15],
                                                                  CONCAT11(b32[0x16],b32[0x17]))))))
                    );
  r->d[2] = CONCAT17(b32[8],CONCAT16(b32[9],CONCAT15(b32[10],CONCAT14(b32[0xb],CONCAT13(b32[0xc],
                                                  CONCAT12(b32[0xd],CONCAT11(b32[0xe],b32[0xf]))))))
                    );
  r->d[3] = CONCAT17(*b32,CONCAT16(b32[1],CONCAT15(b32[2],CONCAT14(b32[3],CONCAT13(b32[4],CONCAT12(
                                                  b32[5],CONCAT11(b32[6],b32[7])))))));
  overflow_00 = secp256k1_scalar_check_overflow(r);
  iVar1 = secp256k1_scalar_reduce(r,overflow_00);
  if (overflow != (int *)0x0) {
    *overflow = iVar1;
  }
  return;
}

Assistant:

static void secp256k1_scalar_set_b32(secp256k1_scalar *r, const unsigned char *b32, int *overflow) {
    int over;
    r->d[0] = (uint64_t)b32[31] | (uint64_t)b32[30] << 8 | (uint64_t)b32[29] << 16 | (uint64_t)b32[28] << 24 | (uint64_t)b32[27] << 32 | (uint64_t)b32[26] << 40 | (uint64_t)b32[25] << 48 | (uint64_t)b32[24] << 56;
    r->d[1] = (uint64_t)b32[23] | (uint64_t)b32[22] << 8 | (uint64_t)b32[21] << 16 | (uint64_t)b32[20] << 24 | (uint64_t)b32[19] << 32 | (uint64_t)b32[18] << 40 | (uint64_t)b32[17] << 48 | (uint64_t)b32[16] << 56;
    r->d[2] = (uint64_t)b32[15] | (uint64_t)b32[14] << 8 | (uint64_t)b32[13] << 16 | (uint64_t)b32[12] << 24 | (uint64_t)b32[11] << 32 | (uint64_t)b32[10] << 40 | (uint64_t)b32[9] << 48 | (uint64_t)b32[8] << 56;
    r->d[3] = (uint64_t)b32[7] | (uint64_t)b32[6] << 8 | (uint64_t)b32[5] << 16 | (uint64_t)b32[4] << 24 | (uint64_t)b32[3] << 32 | (uint64_t)b32[2] << 40 | (uint64_t)b32[1] << 48 | (uint64_t)b32[0] << 56;
    over = secp256k1_scalar_reduce(r, secp256k1_scalar_check_overflow(r));
    if (overflow) {
        *overflow = over;
    }
}